

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

bool __thiscall
acto::core::anon_unknown_0::binding_context_t::process_actors
          (binding_context_t *this,bool need_delete)

{
  value_type poVar1;
  bool bVar2;
  runtime_t *this_00;
  reference ppoVar3;
  _Node_iterator_base<acto::core::object_t_*,_false> local_78;
  _Node_iterator_base<acto::core::object_t_*,_false> local_70;
  const_iterator ai_1;
  lock_guard<std::mutex> g;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_50;
  int local_44;
  undefined1 local_40 [8];
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> msg;
  _Node_iterator_base<acto::core::object_t_*,_false> local_30;
  const_iterator ai;
  bool something_was_processed;
  runtime_t *runtime;
  bool need_delete_local;
  binding_context_t *this_local;
  
  this_00 = runtime_t::instance();
  ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._7_1_ = 0;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
       ::cbegin(&this->actors);
  while( true ) {
    msg._M_t.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
    super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
    super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         std::
         unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
         ::cend(&this->actors);
    bVar2 = std::__detail::operator==
                      (&local_30,(_Node_iterator_base<acto::core::object_t_*,_false> *)&msg);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    do {
      std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
      object_t::select_message((object_t *)local_40);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
      if (bVar2) {
        ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::
                  operator*((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
        poVar1 = *ppoVar3;
        std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
                  (&local_50,
                   (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                   local_40);
        (*(this_00->super_callbacks)._vptr_callbacks[2])(this_00,poVar1,&local_50);
        std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
                  (&local_50);
        ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._7_1_ = 1;
        local_44 = 0;
      }
      else {
        local_44 = 6;
      }
      std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
                ((unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)local_40)
      ;
    } while (local_44 == 0);
    ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                        ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ai_1,&(*ppoVar3)->cs);
    ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                        ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
    (*ppoVar3)->field_0x60 = (*ppoVar3)->field_0x60 & 0xf7;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ai_1);
    if (need_delete) {
      ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                          ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
      runtime_t::deconstruct_object(this_00,*ppoVar3);
    }
    std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator++
              ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_30);
  }
  if (need_delete) {
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
         ::cbegin(&this->actors);
    while( true ) {
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
           ::cend(&this->actors);
      bVar2 = std::__detail::operator==(&local_70,&local_78);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                          ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_70);
      runtime_t::release(this_00,*ppoVar3);
      std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator++
                ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_70);
    }
    std::
    unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
    ::clear(&this->actors);
  }
  return (bool)(ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._7_1_ & 1);
}

Assistant:

bool process_actors(const bool need_delete) {
    auto runtime = runtime_t::instance();
    bool something_was_processed = false;
    // TODO: - switch between active actors to balance message processing.
    //       - detect message loop.
    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      while (auto msg = (*ai)->select_message()) {
        runtime->handle_message(*ai, std::move(msg));
        something_was_processed = true;
      }
      {
        std::lock_guard<std::mutex> g((*ai)->cs);
        (*ai)->scheduled = false;
      }
      if (need_delete) {
        runtime->deconstruct_object(*ai);
      }
    }

    if (need_delete) {
      for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
        runtime->release(*ai);
      }

      actors.clear();
    }

    return something_was_processed;
  }